

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O1

BOOL CreateDirectoryA(LPCSTR lpPathName,LPSECURITY_ATTRIBUTES lpSecurityAttributes)

{
  long lVar1;
  DWORD dwErrCode;
  int iVar2;
  char *lpPath;
  size_t sVar3;
  char *__s;
  size_t sVar4;
  int *piVar5;
  ulong uVar6;
  char *string;
  char *pcVar7;
  size_t sizeInBytes;
  BOOL BVar8;
  char *lpUnixPath;
  long in_FS_OFFSET;
  undefined8 uStack_50;
  char acStack_48 [12];
  DWORD local_3c;
  long lStack_38;
  DWORD dwLastError;
  
  string = acStack_48;
  lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  pcVar7 = acStack_48;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_003291d7;
  if (lpSecurityAttributes != (LPSECURITY_ATTRIBUTES)0x0) {
    lpPath = (char *)0x0;
    uStack_50 = 0x328ffd;
    fprintf(_stderr,"] %s %s:%d","CreateDirectoryA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/directory.cpp"
            ,0x21e);
    uStack_50 = 0x32900e;
    fprintf(_stderr,"lpSecurityAttributes is not NULL as it should be\n");
    local_3c = 0x57;
    string = acStack_48;
    goto LAB_00329198;
  }
  if (lpPathName == (LPCSTR)0x0) {
    local_3c = 3;
LAB_003290e4:
    lpPath = (char *)0x0;
LAB_00329198:
    BVar8 = 0;
  }
  else {
    uStack_50 = 0x329028;
    lpPath = PAL__strdup(lpPathName);
    if (lpPath == (char *)0x0) {
      pcVar7 = acStack_48;
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_003291d7;
      local_3c = 8;
      goto LAB_003290e4;
    }
    uStack_50 = 0x32903c;
    FILEDosToUnixPathA(lpPath);
    uStack_50 = 0x329044;
    sVar3 = strlen(lpPath);
    if (1 < (int)sVar3) {
      uVar6 = sVar3 & 0xffffffff;
      do {
        if (lpPath[uVar6 - 1] != '/') break;
        lpPath[uVar6 - 1] = '\0';
        iVar2 = (int)uVar6;
        uVar6 = (ulong)(iVar2 - 1);
      } while (2 < iVar2);
    }
    string = acStack_48;
    lpUnixPath = lpPath;
    if (*lpPath != '/') {
      uStack_50 = 0x32907e;
      __s = PAL__getcwd((char *)0x0,0x400);
      if (__s == (char *)0x0) {
        pcVar7 = acStack_48;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_003291d7;
        uStack_50 = 0x3290fb;
        piVar5 = __errno_location();
        uStack_50 = 0x329102;
        strerror(*piVar5);
        uStack_50 = 0x329107;
        local_3c = DIRGetLastErrorFromErrno();
        string = acStack_48;
      }
      else {
        uStack_50 = 0x32908e;
        sVar4 = strlen(__s);
        sizeInBytes = (size_t)((int)sVar4 + (int)sVar3 + 2);
        lVar1 = -(sizeInBytes + 0xf & 0xfffffffffffffff0);
        string = acStack_48 + lVar1;
        *(undefined8 *)((long)&uStack_50 + lVar1) = 0x3290bf;
        sprintf_s(string,sizeInBytes,"%s/%s",__s,lpPath);
        *(undefined8 *)((long)&uStack_50 + lVar1) = 0x3290c7;
        PAL_free(__s);
        lpUnixPath = string;
      }
      if (__s == (char *)0x0) goto LAB_00329198;
    }
    string[-8] = '\x1b';
    string[-7] = -0x6f;
    string[-6] = '2';
    string[-5] = '\0';
    string[-4] = '\0';
    string[-3] = '\0';
    string[-2] = '\0';
    string[-1] = '\0';
    FILECanonicalizePath(lpUnixPath);
    string[-8] = '#';
    string[-7] = -0x6f;
    string[-6] = '2';
    string[-5] = '\0';
    string[-4] = '\0';
    string[-3] = '\0';
    string[-2] = '\0';
    string[-1] = '\0';
    sVar3 = strlen(lpUnixPath);
    pcVar7 = string;
    if (0x3ff < sVar3) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_003291d7;
      local_3c = 0xce;
      goto LAB_00329198;
    }
    string[-8] = 'L';
    string[-7] = -0x6f;
    string[-6] = '2';
    string[-5] = '\0';
    string[-4] = '\0';
    string[-3] = '\0';
    string[-2] = '\0';
    string[-1] = '\0';
    iVar2 = mkdir(lpUnixPath,0x1ff);
    if (iVar2 != 0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_003291d7;
      string[-8] = ']';
      string[-7] = -0x6f;
      string[-6] = '2';
      string[-5] = '\0';
      string[-4] = '\0';
      string[-3] = '\0';
      string[-2] = '\0';
      string[-1] = '\0';
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      if (iVar2 == 0x14) {
LAB_0032916e:
        string[-8] = 'z';
        string[-7] = -0x6f;
        string[-6] = '2';
        string[-5] = '\0';
        string[-4] = '\0';
        string[-3] = '\0';
        string[-2] = '\0';
        string[-1] = '\0';
        FILEGetProperNotFoundError(lpUnixPath,&local_3c);
      }
      else if (iVar2 == 0x11) {
        local_3c = 0xb7;
      }
      else {
        if (iVar2 == 2) goto LAB_0032916e;
        local_3c = 5;
      }
      goto LAB_00329198;
    }
    BVar8 = 1;
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_003291d7;
  }
  dwErrCode = local_3c;
  if (local_3c != 0) {
    *(undefined8 *)(string + -8) = 0x3291a7;
    SetLastError(dwErrCode);
  }
  *(undefined8 *)(string + -8) = 0x3291af;
  PAL_free(lpPath);
  pcVar7 = string;
  if (PAL_InitializeChakraCoreCalled != false) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lStack_38) {
      *(code **)(string + -8) = RemoveDirectoryA;
      __stack_chk_fail();
    }
    return BVar8;
  }
LAB_003291d7:
  builtin_strncpy(pcVar7 + -8,"ܑ2",4);
  pcVar7[-4] = '\0';
  pcVar7[-3] = '\0';
  pcVar7[-2] = '\0';
  pcVar7[-1] = '\0';
  abort();
}

Assistant:

BOOL
PALAPI
CreateDirectoryA(
         IN LPCSTR lpPathName,
         IN LPSECURITY_ATTRIBUTES lpSecurityAttributes)
{
    BOOL  bRet = FALSE;
    DWORD dwLastError = 0;
    char *realPath;
    LPSTR UnixPathName = NULL;
    int pathLength;
    int i;
    const int mode = S_IRWXU | S_IRWXG | S_IRWXO;

    PERF_ENTRY(CreateDirectoryA);
    ENTRY("CreateDirectoryA(lpPathName=%p (%s), lpSecurityAttr=%p)\n",
          lpPathName?lpPathName:"NULL",
          lpPathName?lpPathName:"NULL", lpSecurityAttributes);

    if ( lpSecurityAttributes )
    {
        ASSERT("lpSecurityAttributes is not NULL as it should be\n");
        dwLastError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    // Windows returns ERROR_PATH_NOT_FOUND when called with NULL.
    // If we don't have this check, strdup(NULL) segfaults.
    if (lpPathName == NULL)
    {
        ERROR("CreateDirectoryA called with NULL pathname!\n");
        dwLastError = ERROR_PATH_NOT_FOUND;
        goto done;
    }

    UnixPathName = PAL__strdup(lpPathName);
    if (UnixPathName == NULL )
    {
        ERROR("PAL__strdup() failed\n");
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    FILEDosToUnixPathA( UnixPathName );
    // Remove any trailing slashes at the end because mkdir might not
    // handle them appropriately on all platforms.
    pathLength = strlen(UnixPathName);
    i = pathLength;
    while(i > 1)
    {
        if(UnixPathName[i - 1] =='/')
        {
            UnixPathName[i - 1]='\0';
            i--;
        }
        else
        {
            break;
        }
    }

    // Check the constraint for the real path length (should be < MAX_LONGPATH).

    // Get an absolute path.
    if (UnixPathName[0] == '/')
    {
        realPath = UnixPathName;
    }
    else
    {
        const char *cwd = PAL__getcwd(NULL, MAX_LONGPATH);        
        if (NULL == cwd)
        {
            WARN("Getcwd failed with errno=%d [%s]\n", errno, strerror(errno));
            dwLastError = DIRGetLastErrorFromErrno();
            goto done;
        }

        // Copy cwd, '/', path
        int iLen = strlen(cwd) + 1 + pathLength + 1;
        realPath = static_cast<char *>(alloca(iLen));
        sprintf_s(realPath, iLen, "%s/%s", cwd, UnixPathName);

        PAL_free((char *)cwd);
    }
    
    // Canonicalize the path so we can determine its length.
    FILECanonicalizePath(realPath);

    if (strlen(realPath) >= MAX_LONGPATH)
    {
        WARN("UnixPathName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
        dwLastError = ERROR_FILENAME_EXCED_RANGE;
        goto done;
    }

    if ( mkdir(realPath, mode) != 0 )
    {
        TRACE("Creation of directory [%s] was unsuccessful, errno = %d.\n",
              UnixPathName, errno);

        switch( errno )
        {
        case ENOTDIR:
            /* FALL THROUGH */
        case ENOENT:
            FILEGetProperNotFoundError( realPath, &dwLastError );
            goto done;
        case EEXIST:
            dwLastError = ERROR_ALREADY_EXISTS;
            break;
        default:
            dwLastError = ERROR_ACCESS_DENIED;
        }
    }
    else
    {
        TRACE("Creation of directory [%s] was successful.\n", UnixPathName);
        bRet = TRUE;
    }

done:
    if( dwLastError )
    {
        SetLastError( dwLastError );
    }
    PAL_free( UnixPathName );
    LOGEXIT("CreateDirectoryA returns BOOL %d\n", bRet);
    PERF_EXIT(CreateDirectoryA);
    return bRet;
}